

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O1

void __thiscall
icu_63::DayPeriodRulesDataSink::setDayPeriodForHoursFromCutoffs
          (DayPeriodRulesDataSink *this,UErrorCode *errorCode)

{
  DayPeriod DVar1;
  undefined1 *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar5;
  
  puVar2 = (undefined1 *)((long)this->ruleSetNum * 100 + *(long *)((anonymous_namespace)::data + 8))
  ;
  uVar3 = 0;
  do {
    uVar4 = this->cutoffs[uVar3];
    if ((uVar4 & 8) != 0) {
      if (this->period == DAYPERIOD_MIDNIGHT && uVar3 == 0) {
        *puVar2 = 1;
      }
      else {
        if ((uVar3 != 0xc) || (this->period != DAYPERIOD_NOON)) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          return;
        }
        puVar2[1] = 1;
      }
    }
    if ((uVar4 & 6) != 0) {
      uVar6 = uVar3 & 0xffffffff;
      do {
        uVar4 = (int)uVar6 + 1;
        uVar5 = (ulong)uVar4;
        if (uVar3 == uVar5) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          goto LAB_002d01fd;
        }
        uVar6 = (ulong)uVar4;
        if (uVar5 == 0x19) {
          uVar6 = 0;
        }
      } while ((this->cutoffs[(int)(uint)uVar6] & 1) == 0);
      if (uVar3 != uVar6) {
        DVar1 = this->period;
        uVar8 = uVar3 & 0xffffffff;
        do {
          iVar7 = (int)uVar8;
          if (iVar7 == 0x18) {
            iVar7 = 0;
          }
          *(DayPeriod *)(puVar2 + (long)iVar7 * 4 + 4) = DVar1;
          uVar8 = (ulong)(iVar7 + 1U);
        } while (iVar7 + 1U != (uint)uVar6);
      }
LAB_002d01fd:
      if (uVar3 == uVar5) {
        return;
      }
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x19) {
      return;
    }
  } while( true );
}

Assistant:

void setDayPeriodForHoursFromCutoffs(UErrorCode &errorCode) {
        DayPeriodRules &rule = data->rules[ruleSetNum];

        for (int32_t startHour = 0; startHour <= 24; ++startHour) {
            // AT cutoffs must be either midnight or noon.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_AT)) {
                if (startHour == 0 && period == DayPeriodRules::DAYPERIOD_MIDNIGHT) {
                    rule.fHasMidnight = TRUE;
                } else if (startHour == 12 && period == DayPeriodRules::DAYPERIOD_NOON) {
                    rule.fHasNoon = TRUE;
                } else {
                    errorCode = U_INVALID_FORMAT_ERROR;  // Bad data.
                    return;
                }
            }

            // FROM/AFTER and BEFORE must come in a pair.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_FROM) ||
                    cutoffs[startHour] & (1 << CUTOFF_TYPE_AFTER)) {
                for (int32_t hour = startHour + 1;; ++hour) {
                    if (hour == startHour) {
                        // We've gone around the array once and can't find a BEFORE.
                        errorCode = U_INVALID_FORMAT_ERROR;
                        return;
                    }
                    if (hour == 25) { hour = 0; }
                    if (cutoffs[hour] & (1 << CUTOFF_TYPE_BEFORE)) {
                        rule.add(startHour, hour, period);
                        break;
                    }
                }
            }
        }
    }